

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiGetGXTransform(ndicapi *pol,int port,double *transform)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char (*cp) [52];
  
  if (port - 0x31U < 3) {
    cp = pol->GxTransforms + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 1;
    }
    cp = pol->GxPassiveTransforms + (port - 0x41U);
  }
  cVar1 = (*cp)[0];
  iVar2 = 1;
  if ((cVar1 != '\0') && (cVar1 != 'D')) {
    if (cVar1 == 'M') {
      iVar2 = 2;
    }
    else {
      lVar3 = ndiSignedToLong(*cp,6);
      *transform = (double)lVar3 * 0.0001;
      lVar3 = ndiSignedToLong(*cp + 6,6);
      transform[1] = (double)lVar3 * 0.0001;
      lVar3 = ndiSignedToLong(*cp + 0xc,6);
      transform[2] = (double)lVar3 * 0.0001;
      lVar3 = ndiSignedToLong(*cp + 0x12,6);
      transform[3] = (double)lVar3 * 0.0001;
      lVar3 = ndiSignedToLong(*cp + 0x18,7);
      transform[4] = (double)lVar3 * 0.01;
      lVar3 = ndiSignedToLong(*cp + 0x1f,7);
      transform[5] = (double)lVar3 * 0.01;
      lVar3 = ndiSignedToLong(*cp + 0x26,7);
      transform[6] = (double)lVar3 * 0.01;
      lVar3 = ndiSignedToLong(*cp + 0x2d,6);
      transform[7] = (double)lVar3 * 0.0001;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

ndicapiExport int ndiGetGXTransform(ndicapi* pol, int port, double transform[8])
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxTransforms[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->GxPassiveTransforms[port - 'A'];
  }
  else
  {
    return NDI_DISABLED;
  }

  if (*dp == 'D' || *dp == '\0')
  {
    return NDI_DISABLED;
  }
  else if (*dp == 'M')
  {
    return NDI_MISSING;
  }

  transform[0] = ndiSignedToLong(&dp[0],  6) * 0.0001;
  transform[1] = ndiSignedToLong(&dp[6],  6) * 0.0001;
  transform[2] = ndiSignedToLong(&dp[12], 6) * 0.0001;
  transform[3] = ndiSignedToLong(&dp[18], 6) * 0.0001;
  transform[4] = ndiSignedToLong(&dp[24], 7) * 0.01;
  transform[5] = ndiSignedToLong(&dp[31], 7) * 0.01;
  transform[6] = ndiSignedToLong(&dp[38], 7) * 0.01;
  transform[7] = ndiSignedToLong(&dp[45], 6) * 0.0001;

  return NDI_OKAY;
}